

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void binary(_Bool canAssign)

{
  uint8_t byte1;
  TokenType TVar1;
  uint8_t uStack_10;
  
  TVar1 = parser.previous.type;
  parsePrecedence(rules[parser.previous.type].precedence + PREC_ASSIGNMENT);
  switch(TVar1) {
  case TOKEN_MINUS:
    uStack_10 = '\x13';
    break;
  case TOKEN_PLUS:
    uStack_10 = '\x12';
    break;
  default:
    return;
  case TOKEN_SLASH:
    uStack_10 = '\x15';
    break;
  case TOKEN_STAR:
    uStack_10 = '\x14';
    break;
  case TOKEN_BANG_EQUAL:
    byte1 = '\x0f';
    goto LAB_0010418a;
  case TOKEN_EQUAL_EQUAL:
    uStack_10 = '\x0f';
    break;
  case TOKEN_GREATER:
    uStack_10 = '\x10';
    break;
  case TOKEN_GREATER_EQUAL:
    byte1 = '\x11';
    goto LAB_0010418a;
  case TOKEN_LESS:
    uStack_10 = '\x11';
    break;
  case TOKEN_LESS_EQUAL:
    byte1 = '\x10';
LAB_0010418a:
    emitBytes(byte1,'\x16');
    return;
  }
  emitByte(uStack_10);
  return;
}

Assistant:

static void binary(bool canAssign) {
    TokenType operatorType = parser.previous.type;

    ParseRule *rule = getRule(operatorType);
    parsePrecedence((Precedence) (rule->precedence + 1));

    switch (operatorType) {
        case TOKEN_BANG_EQUAL:
            emitBytes(OP_EQUAL, OP_NOT);
            break;
        case TOKEN_EQUAL_EQUAL:
            emitByte(OP_EQUAL);
            break;
        case TOKEN_GREATER:
            emitByte(OP_GREATER);
            break;
        case TOKEN_GREATER_EQUAL:
            emitBytes(OP_LESS, OP_NOT);
            break;
        case TOKEN_LESS:
            emitByte(OP_LESS);
            break;
        case TOKEN_LESS_EQUAL:
            emitBytes(OP_GREATER, OP_NOT);
            break;
        case TOKEN_PLUS:
            emitByte(OP_ADD);
            break;
        case TOKEN_MINUS:
            emitByte(OP_SUBTRACT);
            break;
        case TOKEN_STAR:
            emitByte(OP_MULTIPLY);
            break;
        case TOKEN_SLASH:
            emitByte(OP_DIVIDE);
            break;
        default:
            return; // Unreachable.
    }
}